

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thingdef_expression.cpp
# Opt level: O0

ExpEmit __thiscall FxBoolCast::Emit(FxBoolCast *this,VMFunctionBuilder *build)

{
  VMFunctionBuilder *this_00;
  uint uVar1;
  int iVar2;
  bool bVar3;
  ExpEmit local_28;
  ExpEmit local_23;
  VMFunctionBuilder *pVStack_20;
  ExpEmit from;
  VMFunctionBuilder *build_local;
  FxBoolCast *this_local;
  ExpEmit to;
  
  pVStack_20 = build;
  uVar1 = (*this->basex->_vptr_FxExpression[7])(this->basex,build);
  local_23._0_2_ = SUB42(uVar1,0);
  local_23._2_1_ = SUB41(uVar1 >> 0x10,0);
  if ((uVar1 & 0x10000) != 0) {
    __assert_fail("!from.Konst",
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_expression.cpp"
                  ,0x1d1,"virtual ExpEmit FxBoolCast::Emit(VMFunctionBuilder *)");
  }
  iVar2 = (*(this->basex->ValueType->super_DObject)._vptr_DObject[0x12])();
  bVar3 = true;
  if (iVar2 != 0) {
    iVar2 = (*(this->basex->ValueType->super_DObject)._vptr_DObject[0x12])();
    bVar3 = true;
    if (iVar2 != 1) {
      iVar2 = (*(this->basex->ValueType->super_DObject)._vptr_DObject[0x12])();
      bVar3 = iVar2 == 3;
    }
  }
  if (bVar3) {
    ExpEmit::ExpEmit((ExpEmit *)((long)&this_local + 5),pVStack_20,0);
    ExpEmit::Free(&local_23,pVStack_20);
    VMFunctionBuilder::Emit(pVStack_20,1,(uint)this_local._5_1_,0);
    this_00 = pVStack_20;
    if (local_23.RegType == '\0') {
      VMFunctionBuilder::Emit(pVStack_20,0x73,1,(uint)local_23.RegNum,(uint)this_local._5_1_);
    }
    else if (local_23.RegType == '\x01') {
      uVar1 = (uint)local_23.RegNum;
      iVar2 = VMFunctionBuilder::GetConstantFloat(pVStack_20,0.0);
      VMFunctionBuilder::Emit(this_00,0x98,1,uVar1,iVar2);
    }
    else if (local_23.RegType == '\x03') {
      uVar1 = (uint)local_23.RegNum;
      iVar2 = VMFunctionBuilder::GetConstantAddress(pVStack_20,(void *)0x0,'\0');
      VMFunctionBuilder::Emit(this_00,0xb4,1,uVar1,iVar2);
    }
    VMFunctionBuilder::Emit(pVStack_20,0x37,1);
    VMFunctionBuilder::Emit(pVStack_20,1,(uint)this_local._5_1_,1);
    local_28._2_1_ = this_local._7_1_;
    local_28.RegNum = this_local._5_1_;
    local_28.RegType = this_local._6_1_;
    return local_28;
  }
  __assert_fail("basex->ValueType->GetRegType() == REGT_INT || basex->ValueType->GetRegType() == REGT_FLOAT || basex->ValueType->GetRegType() == REGT_POINTER"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_expression.cpp"
                ,0x1d2,"virtual ExpEmit FxBoolCast::Emit(VMFunctionBuilder *)");
}

Assistant:

ExpEmit FxBoolCast::Emit(VMFunctionBuilder *build)
{
	ExpEmit from = basex->Emit(build);
	assert(!from.Konst);
	assert(basex->ValueType->GetRegType() == REGT_INT || basex->ValueType->GetRegType() == REGT_FLOAT || basex->ValueType->GetRegType() == REGT_POINTER);
	ExpEmit to(build, REGT_INT);
	from.Free(build);

	// Preload result with 0.
	build->Emit(OP_LI, to.RegNum, 0);

	// Check source against 0.
	if (from.RegType == REGT_INT)
	{
		build->Emit(OP_EQ_R, 1, from.RegNum, to.RegNum);
	}
	else if (from.RegType == REGT_FLOAT)
	{
		build->Emit(OP_EQF_K, 1, from.RegNum, build->GetConstantFloat(0.));
	}
	else if (from.RegType == REGT_POINTER)
	{
		build->Emit(OP_EQA_K, 1, from.RegNum, build->GetConstantAddress(nullptr, ATAG_GENERIC));
	}
	build->Emit(OP_JMP, 1);

	// Reload result with 1 if the comparison fell through.
	build->Emit(OP_LI, to.RegNum, 1);

	return to;
}